

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_widget_width(nk_context *ctx)

{
  undefined1 local_28 [8];
  nk_rect bounds;
  nk_context *ctx_local;
  
  bounds._8_8_ = ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4986,"float nk_widget_width(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
      ctx_local._4_4_ = 0.0;
    }
    else {
      nk_layout_peek((nk_rect *)local_28,ctx);
      ctx_local._4_4_ = bounds.x;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x4987,"float nk_widget_width(struct nk_context *)");
}

Assistant:

NK_API float
nk_widget_width(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    return bounds.w;
}